

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O0

int XLearnCreate(char *model_type,XL *out)

{
  XLearn *pXVar1;
  HyperParam *pHVar2;
  undefined8 *in_RSI;
  char *in_RDI;
  runtime_error *_except_;
  XLearn *xl;
  XLearn *in_stack_ffffffffffffff90;
  allocator *paVar3;
  allocator local_51;
  string local_50 [48];
  XLearn *local_20;
  undefined8 *local_18;
  char *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  pXVar1 = (XLearn *)operator_new(0x4b8);
  XLearn::XLearn(in_stack_ffffffffffffff90);
  paVar3 = &local_51;
  local_20 = pXVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,local_10,paVar3);
  pHVar2 = XLearn::GetHyperParam(local_20);
  std::__cxx11::string::operator=((string *)&pHVar2->score_func,local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  *local_18 = local_20;
  return 0;
}

Assistant:

XL_DLL int XLearnCreate(const char *model_type, XL *out) {
  API_BEGIN();
  XLearn* xl = new XLearn;
  xl->GetHyperParam().score_func = std::string(model_type);
  *out = xl;
  API_END();
}